

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * google::protobuf::DoubleToBuffer(double value,char *buffer)

{
  int iVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  double parsed_value;
  double local_50;
  LogMessage local_48;
  
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (NAN(value)) {
        builtin_strncpy(buffer,"nan",4);
      }
      else {
        local_50 = value;
        iVar1 = snprintf(buffer,0x20,"%.*g",0xf);
        if (iVar1 - 0x20U < 0xffffffe1) {
          internal::LogMessage::LogMessage
                    (&local_48,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                     ,0x4f1);
          pLVar2 = internal::LogMessage::operator<<
                             (&local_48,
                              "CHECK failed: snprintf_result > 0 && snprintf_result < kDoubleToBufferSize: "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&parsed_value,pLVar2);
          internal::LogMessage::~LogMessage(&local_48);
        }
        parsed_value = internal::NoLocaleStrtod(buffer,(char **)0x0);
        if ((parsed_value != local_50) || (NAN(parsed_value) || NAN(local_50))) {
          iVar1 = snprintf(buffer,0x20,"%.*g",0x11);
          if (iVar1 - 0x20U < 0xffffffe1) {
            internal::LogMessage::LogMessage
                      (&local_48,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                       ,0x4ff);
            pLVar2 = internal::LogMessage::operator<<
                               (&local_48,
                                "CHECK failed: snprintf_result > 0 && snprintf_result < kDoubleToBufferSize: "
                               );
            internal::LogFinisher::operator=(&local_59,pLVar2);
            internal::LogMessage::~LogMessage(&local_48);
          }
        }
        DelocalizeRadix(buffer);
      }
    }
    else {
      builtin_strncpy(buffer,"-inf",5);
    }
  }
  else {
    builtin_strncpy(buffer,"inf",4);
  }
  return buffer;
}

Assistant:

char* DoubleToBuffer(double value, char* buffer) {
  // DBL_DIG is 15 for IEEE-754 doubles, which are used on almost all
  // platforms these days.  Just in case some system exists where DBL_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(DBL_DIG < 20, "DBL_DIG_is_too_big");

  if (value == std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);

  // We need to make parsed_value volatile in order to force the compiler to
  // write it out to the stack.  Otherwise, it may keep the value in a
  // register, and if it does that, it may keep it as a long double instead
  // of a double.  This long double may have extra bits that make it compare
  // unequal to "value" even though it would be exactly equal if it were
  // truncated to a double.
  volatile double parsed_value = internal::NoLocaleStrtod(buffer, nullptr);
  if (parsed_value != value) {
    snprintf_result =
        snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG + 2, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}